

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

bool __thiscall
Imath_2_5::Box<Imath_2_5::Vec3<float>_>::intersects
          (Box<Imath_2_5::Vec3<float>_> *this,Vec3<float> *point)

{
  float fVar1;
  float *pfVar2;
  Vec3<float> *in_RSI;
  Vec3<float> *in_RDI;
  
  pfVar2 = Vec3<float>::operator[](in_RSI,0);
  fVar1 = *pfVar2;
  pfVar2 = Vec3<float>::operator[](in_RDI,0);
  if (*pfVar2 <= fVar1) {
    pfVar2 = Vec3<float>::operator[](in_RSI,0);
    fVar1 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](in_RDI + 1,0);
    if (fVar1 < *pfVar2 || fVar1 == *pfVar2) {
      pfVar2 = Vec3<float>::operator[](in_RSI,1);
      fVar1 = *pfVar2;
      pfVar2 = Vec3<float>::operator[](in_RDI,1);
      if (*pfVar2 <= fVar1) {
        pfVar2 = Vec3<float>::operator[](in_RSI,1);
        fVar1 = *pfVar2;
        pfVar2 = Vec3<float>::operator[](in_RDI + 1,1);
        if (fVar1 < *pfVar2 || fVar1 == *pfVar2) {
          pfVar2 = Vec3<float>::operator[](in_RSI,2);
          fVar1 = *pfVar2;
          pfVar2 = Vec3<float>::operator[](in_RDI,2);
          if (*pfVar2 <= fVar1) {
            pfVar2 = Vec3<float>::operator[](in_RSI,2);
            fVar1 = *pfVar2;
            pfVar2 = Vec3<float>::operator[](in_RDI + 1,2);
            if (fVar1 < *pfVar2 || fVar1 == *pfVar2) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool
Box<Vec3<T> >::intersects (const Vec3<T> &point) const
{
    if (point[0] < min[0] || point[0] > max[0] ||
        point[1] < min[1] || point[1] > max[1] ||
        point[2] < min[2] || point[2] > max[2])
        return false;

    return true;
}